

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_func_get_arg(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  jx9_vm *pVm;
  VmFrame *pVVar3;
  jx9_value *pjVar4;
  void *pvVar5;
  
  pVm = pCtx->pVm;
  if ((nArg < 1) || (pVVar3 = pVm->pFrame, pVVar3->pParent == (VmFrame *)0x0)) {
    jx9VmThrowError(pVm,&pCtx->pFunc->sName,2,"Called in the global scope");
  }
  else {
    pjVar4 = *apArg;
    jx9MemObjToInteger(pjVar4);
    iVar1 = *(int *)&pjVar4->x;
    if ((((-1 < iVar1) && (iVar1 < (int)(pVVar3->sArg).nUsed)) &&
        (pvVar5 = (pVVar3->sArg).pBase, pvVar5 != (void *)0x0)) &&
       ((uVar2 = *(uint *)((long)pvVar5 + (ulong)(iVar1 * (pVVar3->sArg).eSize)),
        uVar2 < (pVm->aMemObj).nUsed && (pvVar5 = (pVm->aMemObj).pBase, pvVar5 != (void *)0x0)))) {
      jx9MemObjStore((jx9_value *)((long)pvVar5 + (ulong)(uVar2 * (pVm->aMemObj).eSize)),pCtx->pRet)
      ;
      return 0;
    }
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_func_get_arg(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot = 0;
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( nArg < 1 || pFrame->pParent == 0 ){
		/* Global frame or Missing arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired index */
	nArg = jx9_value_to_int(apArg[0]);
	if( nArg < 0 || nArg >= (int)SySetUsed(&pFrame->sArg) ){
		/* Invalid index, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired argument */
	if( (pSlot = (VmSlot *)SySetAt(&pFrame->sArg, (sxu32)nArg)) != 0 ){
		if( (pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx)) != 0 ){
			/* Return the desired argument */
			jx9_result_value(pCtx, (jx9_value *)pObj);
		}else{
			/* No such argument, return false */
			jx9_result_bool(pCtx, 0);
		}
	}else{
		/* CAN'T HAPPEN */
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}